

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_integer_test.cc
# Opt level: O3

void __thiscall AomLeb128_EncodeTest_Test::TestBody(AomLeb128_EncodeTest_Test *this)

{
  undefined8 *puVar1;
  SEARCH_METHODS *pSVar2;
  ulong uVar3;
  uint8_t expected_bytes [3];
  size_t bytes_written;
  uint8_t write_buffer [4];
  Message local_60;
  AssertHelper local_58;
  internal local_50 [8];
  undefined8 *local_48;
  uchar local_3c [4];
  size_t local_38;
  uint8_t local_2c [4];
  
  local_3c[2] = 0x26;
  local_3c[0] = 0xe5;
  local_3c[1] = 0x8e;
  local_2c[0] = '\0';
  local_2c[1] = '\0';
  local_2c[2] = '\0';
  local_2c[3] = '\0';
  local_38 = 0;
  local_60.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = aom_uleb_encode(0x98765,4,local_2c,&local_38);
  local_58.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<int,int>
            (local_50,
             "aom_uleb_encode(test_value, kWriteBufferSize, &write_buffer[0], &bytes_written)","0",
             (int *)&local_60,(int *)&local_58);
  puVar1 = local_48;
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message(&local_60);
    if (local_48 == (undefined8 *)0x0) {
      pSVar2 = "";
    }
    else {
      pSVar2 = (SEARCH_METHODS *)*local_48;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/aom_integer_test.cc"
               ,0x39,(char *)pSVar2);
    testing::internal::AssertHelper::operator=(&local_58,&local_60);
  }
  else {
    if (local_48 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_48 != local_48 + 2) {
        operator_delete((undefined8 *)*local_48);
      }
      operator_delete(puVar1);
    }
    local_60.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_4_ = 3;
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
              (local_50,"bytes_written","3u",&local_38,(uint *)&local_60);
    puVar1 = local_48;
    if (local_50[0] == (internal)0x0) {
      testing::Message::Message(&local_60);
      if (local_48 == (undefined8 *)0x0) {
        pSVar2 = "";
      }
      else {
        pSVar2 = (SEARCH_METHODS *)*local_48;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_58,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/aom_integer_test.cc"
                 ,0x3a,(char *)pSVar2);
      testing::internal::AssertHelper::operator=(&local_58,&local_60);
    }
    else {
      if (local_48 != (undefined8 *)0x0) {
        if ((undefined8 *)*local_48 != local_48 + 2) {
          operator_delete((undefined8 *)*local_48);
        }
        operator_delete(puVar1);
      }
      if (local_38 == 0) {
        return;
      }
      uVar3 = 0;
      while (testing::internal::CmpHelperEQ<unsigned_char,unsigned_char>
                       (local_50,"write_buffer[i]","expected_bytes[i]",local_2c + uVar3,
                        local_3c + uVar3), puVar1 = local_48, local_50[0] != (internal)0x0) {
        if (local_48 != (undefined8 *)0x0) {
          if ((undefined8 *)*local_48 != local_48 + 2) {
            operator_delete((undefined8 *)*local_48);
          }
          operator_delete(puVar1);
        }
        uVar3 = uVar3 + 1;
        if (local_38 <= uVar3) {
          return;
        }
      }
      testing::Message::Message(&local_60);
      if (local_48 == (undefined8 *)0x0) {
        pSVar2 = "";
      }
      else {
        pSVar2 = (SEARCH_METHODS *)*local_48;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_58,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/aom_integer_test.cc"
                 ,0x3c,(char *)pSVar2);
      testing::internal::AssertHelper::operator=(&local_58,&local_60);
    }
  }
  testing::internal::AssertHelper::~AssertHelper(&local_58);
  if ((long *)CONCAT44(local_60.ss_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl._4_4_,
                       (int)local_60.ss_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl) != (long *)0x0) {
    (**(code **)(*(long *)CONCAT44(local_60.ss_._M_t.
                                   super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                   ._M_head_impl._4_4_,
                                   (int)local_60.ss_._M_t.
                                        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        .
                                        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                        ._M_head_impl) + 8))();
  }
  if (local_48 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_48 != local_48 + 2) {
      operator_delete((undefined8 *)*local_48);
    }
    operator_delete(local_48);
  }
  return;
}

Assistant:

TEST(AomLeb128, EncodeTest) {
  const uint32_t test_value = 0x98765;  // 624485
  const uint8_t expected_bytes[3] = { 0xE5, 0x8E, 0x26 };
  const size_t kWriteBufferSize = 4;
  uint8_t write_buffer[kWriteBufferSize] = { 0 };
  size_t bytes_written = 0;
  ASSERT_EQ(aom_uleb_encode(test_value, kWriteBufferSize, &write_buffer[0],
                            &bytes_written),
            0);
  ASSERT_EQ(bytes_written, 3u);
  for (size_t i = 0; i < bytes_written; ++i) {
    ASSERT_EQ(write_buffer[i], expected_bytes[i]);
  }
}